

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void wallet::WaitForDeleteWallet(shared_ptr<wallet::CWallet> *wallet)

{
  long lVar1;
  GlobalMutex *pszName;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pszFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  UniqueLock<GlobalMutex> lock;
  UniqueLock<GlobalMutex> criticalblock13;
  string name;
  CWallet *in_stack_ffffffffffffff58;
  key_type *in_stack_ffffffffffffff60;
  __shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff7b;
  int in_stack_ffffffffffffff7c;
  int nLine;
  char *in_stack_ffffffffffffff80;
  GlobalMutex *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffff58);
  CWallet::GetName_abi_cxx11_(in_stack_ffffffffffffff58);
  std::__cxx11::string::string(in_RDI,in_stack_ffffffffffffff98);
  pszName = MaybeCheckNotHeld<GlobalMutex>((GlobalMutex *)in_stack_ffffffffffffff58);
  UniqueLock<GlobalMutex>::UniqueLock
            ((UniqueLock<GlobalMutex> *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (char *)pszName,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             (bool)in_stack_ffffffffffffff7b);
  pVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  pszFile = pVar2.first._M_node;
  nLine = CONCAT13(pVar2.second,(int3)in_stack_ffffffffffffff7c);
  UniqueLock<GlobalMutex>::~UniqueLock((UniqueLock<GlobalMutex> *)in_stack_ffffffffffffff58);
  std::__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>::reset(in_stack_ffffffffffffff68);
  MaybeCheckNotHeld<GlobalMutex>((GlobalMutex *)in_stack_ffffffffffffff58);
  UniqueLock<GlobalMutex>::UniqueLock
            ((UniqueLock<GlobalMutex> *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (char *)pszName,(char *)pszFile._M_node,nLine,(bool)in_stack_ffffffffffffff7b);
  while( true ) {
    in_stack_ffffffffffffff68 =
         (__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    if (in_stack_ffffffffffffff68 !=
        (__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)0x1) break;
    std::condition_variable::wait((unique_lock *)g_wallet_release_cv);
  }
  UniqueLock<GlobalMutex>::~UniqueLock((UniqueLock<GlobalMutex> *)in_stack_ffffffffffffff58);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WaitForDeleteWallet(std::shared_ptr<CWallet>&& wallet)
{
    // Mark wallet for unloading.
    const std::string name = wallet->GetName();
    {
        LOCK(g_wallet_release_mutex);
        g_unloading_wallet_set.insert(name);
        // Do not expect to be the only one removing this wallet.
        // Multiple threads could simultaneously be waiting for deletion.
    }

    // Time to ditch our shared_ptr and wait for FlushAndDeleteWallet call.
    wallet.reset();
    {
        WAIT_LOCK(g_wallet_release_mutex, lock);
        while (g_unloading_wallet_set.count(name) == 1) {
            g_wallet_release_cv.wait(lock);
        }
    }
}